

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O1

bool __thiscall
Assimp::IFC::TempOpening::DistanceSorter::operator()
          (DistanceSorter *this,TempOpening *a,TempOpening *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  IfcVector3 local_48;
  IfcVector3 local_30;
  
  TempMesh::Center(&local_30,
                   (a->profileMesh).
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  dVar1 = local_30.x - (this->base).x;
  dVar2 = local_30.y - (this->base).y;
  dVar3 = local_30.z - (this->base).z;
  TempMesh::Center(&local_48,
                   (b->profileMesh).
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_48.x = local_48.x - (this->base).x;
  local_48.y = local_48.y - (this->base).y;
  local_48.z = local_48.z - (this->base).z;
  return dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2 <
         local_48.z * local_48.z + local_48.x * local_48.x + local_48.y * local_48.y;
}

Assistant:

bool operator () (const TempOpening& a, const TempOpening& b) const {
            return (a.profileMesh->Center()-base).SquareLength() < (b.profileMesh->Center()-base).SquareLength();
        }